

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O3

int SUNMatScaleAdd_Dense(realtype c,SUNMatrix A,SUNMatrix B)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  iVar6 = SMCompatible_Dense(A,B);
  if (iVar6 == 0) {
    iVar6 = -0x2bd;
  }
  else {
    puVar3 = (uint *)A->content;
    uVar1 = puVar3[1];
    if (0 < (long)(int)uVar1) {
      uVar2 = *puVar3;
      lVar7 = 0;
      do {
        if (0 < (int)uVar2) {
          lVar4 = *(long *)(*(long *)(puVar3 + 6) + lVar7 * 8);
          lVar5 = *(long *)(*(long *)((long)B->content + 0x18) + lVar7 * 8);
          uVar8 = 0;
          do {
            *(double *)(lVar4 + uVar8 * 8) =
                 *(double *)(lVar4 + uVar8 * 8) * c + *(double *)(lVar5 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != (int)uVar1);
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int SUNMatScaleAdd_Dense(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Dense(A, B))
    return SUNMAT_ILL_INPUT;

  /* Perform operation */
  for (j=0; j<SM_COLUMNS_D(A); j++)
    for (i=0; i<SM_ROWS_D(A); i++)
      SM_ELEMENT_D(A,i,j) = c*SM_ELEMENT_D(A,i,j) + SM_ELEMENT_D(B,i,j);
  return SUNMAT_SUCCESS;
}